

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

xmlChar * xmlPatScanNCName(xmlPatParserContextPtr ctxt)

{
  xmlPatParserContextPtr pxVar1;
  uint uVar2;
  xmlChar *pxVar3;
  int iVar4;
  byte *pbVar5;
  byte *cur;
  byte *cur_00;
  int len;
  int local_3c;
  xmlPatParserContextPtr local_38;
  
  pbVar5 = ctxt->cur;
  cur_00 = pbVar5;
  while( true ) {
    if ((0x20 < (ulong)*cur_00) || ((0x100002600U >> ((ulong)*cur_00 & 0x3f) & 1) == 0)) break;
    cur_00 = cur_00 + 1;
    ctxt->cur = cur_00;
    pbVar5 = (byte *)(ulong)((int)pbVar5 + 1);
  }
  uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur_00,&local_3c);
  if ((int)uVar2 < 0x100) {
    if ((uVar2 - 0xc0 < 0x17) ||
       (((((uVar2 & 0xffffffdf) - 0x41 < 0x1a || (uVar2 == 0x5f)) || (0xf7 < (int)uVar2)) ||
        (uVar2 - 0xd8 < 0x1f)))) {
LAB_0016aae2:
      cur = cur_00;
      local_38 = ctxt;
      do {
        if ((int)uVar2 < 0x100) {
          if (((0x16 < uVar2 - 0xc0) && (0x19 < (uVar2 & 0xffffffdf) - 0x41)) &&
             ((9 < uVar2 - 0x30 && (((int)uVar2 < 0xf8 && (0x1e < uVar2 - 0xd8)))))) {
LAB_0016ab8f:
            if ((0x32 < uVar2 - 0x2d) ||
               ((0x4000000000003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) == 0)) {
              if ((int)uVar2 < 0x100) {
                uVar2 = (uint)(uVar2 == 0xb7);
              }
              else {
                iVar4 = xmlCharInRange(uVar2,&xmlIsCombiningGroup);
                if (iVar4 != 0) goto LAB_0016aba8;
                uVar2 = xmlCharInRange(uVar2,&xmlIsExtenderGroup);
              }
              pxVar1 = local_38;
              if (uVar2 == 0) {
                iVar4 = (int)cur - (int)pbVar5;
                if (local_38->dict == (xmlDictPtr)0x0) {
                  pxVar3 = xmlStrndup(cur_00,iVar4);
                }
                else {
                  pxVar3 = xmlDictLookup(local_38->dict,cur_00,iVar4);
                }
                pxVar1->cur = cur;
                return pxVar3;
              }
            }
          }
        }
        else {
          iVar4 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
          if (((iVar4 == 0) && ((8 < uVar2 - 0x3021 && 0x51a5 < uVar2 - 0x4e00) && uVar2 != 0x3007))
             && (iVar4 = xmlCharInRange(uVar2,&xmlIsDigitGroup), iVar4 == 0)) goto LAB_0016ab8f;
        }
LAB_0016aba8:
        cur = cur + local_3c;
        uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,&local_3c);
      } while( true );
    }
  }
  else {
    iVar4 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
    if ((iVar4 != 0) ||
       ((0xfffffff6 < uVar2 - 0x302a || 0xffffae59 < uVar2 - 0x9fa6) || uVar2 == 0x3007))
    goto LAB_0016aae2;
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlPatScanNCName(xmlPatParserContextPtr ctxt) {
    const xmlChar *q, *cur;
    xmlChar *ret = NULL;
    int val, len;

    SKIP_BLANKS;

    cur = q = CUR_PTR;
    val = xmlStringCurrentChar(NULL, cur, &len);
    if (!IS_LETTER(val) && (val != '_'))
	return(NULL);

    while ((IS_LETTER(val)) || (IS_DIGIT(val)) ||
           (val == '.') || (val == '-') ||
	   (val == '_') ||
	   (IS_COMBINING(val)) ||
	   (IS_EXTENDER(val))) {
	cur += len;
	val = xmlStringCurrentChar(NULL, cur, &len);
    }
    if (ctxt->dict)
	ret = (xmlChar *) xmlDictLookup(ctxt->dict, q, cur - q);
    else
	ret = xmlStrndup(q, cur - q);
    CUR_PTR = cur;
    return(ret);
}